

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O0

string * banksia::getFullPath_abi_cxx11_(char *path)

{
  char *pcVar1;
  char *in_RSI;
  string *in_RDI;
  char s [4096];
  char *ptr;
  char *home;
  char buff [4096];
  char *local_2058;
  allocator local_2029;
  char local_2028 [4096];
  char *local_1028;
  char *local_1020;
  char local_1018 [4104];
  char *local_10;
  
  local_10 = in_RSI;
  if (*in_RSI == '~') {
    local_1020 = getenv("HOME");
    if (local_1020 != (char *)0x0) {
      pcVar1 = strcpy(local_2028,local_1020);
      pcVar1 = strcat(pcVar1,local_10 + 1);
      local_1028 = realpath(pcVar1,local_1018);
      goto LAB_001f808b;
    }
  }
  local_1028 = realpath(local_10,local_1018);
LAB_001f808b:
  if (local_1028 == (char *)0x0) {
    local_2058 = local_10;
  }
  else {
    local_2058 = local_1028;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_2058,&local_2029);
  std::allocator<char>::~allocator((allocator<char> *)&local_2029);
  return in_RDI;
}

Assistant:

std::string getFullPath(const char* path)
    {
#ifdef _WIN32
        char buff[_MAX_PATH];
        if (_fullpath( buff, path, _MAX_PATH) != NULL ) {
            return buff;
        }
        return path;
        
#else
        char buff[PATH_MAX];
        char *home, *ptr;
        if (*path == '~' && (home = getenv("HOME"))) {
            char s[PATH_MAX];
            ptr = realpath(strcat(strcpy(s, home), path+1), buff);
        } else {
            ptr = realpath(path, buff);
        }
        return ptr ? ptr : path;
#endif
    }